

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O0

void Vec_QueMoveDown(Vec_Que_t *p,int v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int local_20;
  int local_1c;
  int child;
  int i;
  float Cost;
  int v_local;
  Vec_Que_t *p_local;
  
  fVar1 = Vec_QuePrio(p,v);
  local_1c = p->pOrder[v];
  while (local_20 = local_1c * 2, local_20 < p->nSize) {
    if (local_20 + 1 < p->nSize) {
      fVar2 = Vec_QuePrio(p,p->pHeap[local_20]);
      fVar3 = Vec_QuePrio(p,p->pHeap[local_20 + 1]);
      if (fVar2 < fVar3) {
        local_20 = local_20 + 1;
      }
    }
    if (p->nSize <= local_20) {
      __assert_fail("child < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
    }
    fVar2 = Vec_QuePrio(p,p->pHeap[local_20]);
    if (fVar2 <= fVar1) break;
    p->pHeap[local_1c] = p->pHeap[local_20];
    p->pOrder[p->pHeap[local_1c]] = local_1c;
    local_1c = local_20;
  }
  p->pHeap[local_1c] = v;
  p->pOrder[v] = local_1c;
  return;
}

Assistant:

static inline void Vec_QueMoveDown( Vec_Que_t * p, int v )
{
    float Cost = Vec_QuePrio(p, v);
    int i      = p->pOrder[v];
    int child  = i << 1;
    while ( child < p->nSize )
    {
        if ( child + 1 < p->nSize && Vec_QuePrio(p, p->pHeap[child]) < Vec_QuePrio(p, p->pHeap[child+1]) )
            child++;
        assert( child < p->nSize );
        if ( Cost >= Vec_QuePrio(p, p->pHeap[child]))
            break;
        p->pHeap[i]            = p->pHeap[child];
        p->pOrder[p->pHeap[i]] = i;
        i                      = child;
        child                  = child << 1;
    }
    p->pHeap[i]  = v;
    p->pOrder[v] = i;
}